

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int print_gau_cnt(char *fn)

{
  int iVar1;
  cmd_ln_t *cmdln;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  vector_t ***wt_var;
  vector_t ***wt_mean;
  int32 pass2var;
  uint32 n_density;
  uint32 n_feat;
  uint32 n_mgau;
  uint32 *veclen;
  float32 ***dnom;
  char mv_fmt [64];
  
  iVar1 = s3gaucnt_read(fn,&wt_mean,&wt_var,&pass2var,&dnom,&n_mgau,&n_feat,&n_density,&veclen);
  if (iVar1 == 0) {
    if (wt_var == (vector_t ***)0x0) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/printp/main.c"
              ,0x137,"No variance counts\n");
    }
    if (pass2var != 0) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/printp/main.c"
              ,0x13a,"-2passvar yes\n");
    }
    cmdln = cmd_ln_get();
    lVar2 = cmd_ln_int_r(cmdln,"-sigfig");
    sprintf(mv_fmt,"%%.%de,%%.%de ",(ulong)((int)lVar2 - 1));
    for (uVar5 = 0; uVar5 < n_mgau; uVar5 = uVar5 + 1) {
      printf("mgau %u\n",uVar5 & 0xffffffff);
      for (uVar6 = 0; uVar6 < n_feat; uVar6 = uVar6 + 1) {
        printf("feature %u\n",uVar6 & 0xffffffff);
        for (uVar3 = 0; uVar3 < n_density; uVar3 = uVar3 + 1) {
          printf("density %u: ",uVar3 & 0xffffffff);
          printf(e_fmt,(double)(float)dnom[uVar5][uVar6][uVar3]);
          for (uVar4 = 0; uVar4 < veclen[uVar6]; uVar4 = uVar4 + 1) {
            if (wt_var == (vector_t ***)0x0) {
              dVar7 = 0.0;
            }
            else {
              dVar7 = (double)wt_var[uVar5][uVar6][uVar3][uVar4];
            }
            printf(mv_fmt,(double)wt_mean[uVar5][uVar6][uVar3][uVar4],dVar7);
          }
          putchar(10);
        }
      }
    }
    if (wt_mean != (vector_t ***)0x0) {
      ckd_free(***wt_mean);
      ckd_free_3d(wt_mean);
    }
    if (wt_var != (vector_t ***)0x0) {
      ckd_free(***wt_var);
      ckd_free_3d(wt_var);
    }
    ckd_free(veclen);
    iVar1 = 0;
  }
  else {
    fflush(_stdout);
    perror(fn);
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int
print_gau_cnt(const char *fn)
{
    vector_t ***wt_mean;
    vector_t ***wt_var;
    float32  ***dnom;
    uint32 n_mgau;
    uint32 n_feat;
    uint32 n_density;
    uint32 *veclen;
    uint32 i, j, k, l;
    int32 pass2var;
    char mv_fmt[64];
    int32 sf;

    if (s3gaucnt_read(fn,
		      &wt_mean,
		      &wt_var,
		      &pass2var,
		      &dnom,
		      &n_mgau,
		      &n_feat,
		      &n_density,
		      &veclen) != S3_SUCCESS) {
	fflush(stdout);
	perror(fn);
	    
	return S3_ERROR;
    }

    if (wt_var == NULL) {
	E_INFO("No variance counts\n");
    }
    if (pass2var) {
	E_INFO("-2passvar yes\n");
    }

    sf = cmd_ln_int32("-sigfig");

    sprintf(mv_fmt, "%%.%de,%%.%de ", sf-1, sf-1);

    for (i = 0; i < n_mgau; i++) {
	printf("mgau %u\n", i);
	for (j = 0; j < n_feat; j++) {
	    printf("feature %u\n", j);
	    for (k = 0; k < n_density; k++) {
		printf("density %u: ", k);
		
		printf(e_fmt, dnom[i][j][k]);
		for (l = 0; l < veclen[j]; l++) {
		    printf(mv_fmt,
			   wt_mean[i][j][k][l],
			   (wt_var ? wt_var[i][j][k][l] : 0.0));
		}
		printf("\n");
	    }
	}
    }

    if (wt_mean) {
	ckd_free(wt_mean[0][0][0]);
	ckd_free_3d((void ***)wt_mean);
    }

    if (wt_var) {
	ckd_free(wt_var[0][0][0]);
	ckd_free_3d((void ***)wt_var);
    }
    ckd_free(veclen);
    return S3_SUCCESS;
}